

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::drawItems
          (QGraphicsScene *this,QPainter *painter,int numItems,QGraphicsItem **items,
          QStyleOptionGraphicsItem *options,QWidget *widget)

{
  bool bVar1;
  Int IVar2;
  QGraphicsScenePrivate *pQVar3;
  void *__src;
  QGraphicsItem *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  const_iterator o;
  QGraphicsItem **ppQVar6;
  int in_EDX;
  QTransform *in_RSI;
  long in_R9;
  long in_FS_OFFSET;
  double dVar7;
  QGraphicsItem *topLevelItem;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  QGraphicsItem *item;
  int i;
  quint32 oldRectAdjust;
  QRegion *expose;
  QGraphicsView *view;
  qreal opacity;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsItem_*> topLevelItems;
  QWidget *in_stack_000000b8;
  QTransform viewTransform;
  QTransform *in_stack_000002b0;
  parameter_type in_stack_fffffffffffffee8;
  QGraphicsItem *in_stack_fffffffffffffef0;
  QGraphicsView *local_108;
  undefined4 in_stack_ffffffffffffff18;
  int iVar8;
  undefined4 in_stack_ffffffffffffff1c;
  quint32 qVar9;
  const_iterator local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4> local_5c;
  undefined1 local_58 [40];
  qreal in_stack_ffffffffffffffd0;
  QRegion *in_stack_ffffffffffffffd8;
  QTransform *in_stack_ffffffffffffffe0;
  QPainter *in_stack_ffffffffffffffe8;
  QGraphicsItem *in_stack_fffffffffffffff0;
  QGraphicsScenePrivate *this_00;
  
  this_00 = *(QGraphicsScenePrivate **)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsScene *)0x9d88a9);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d88bf);
  if (!bVar1) {
    QGraphicsScenePrivate::_q_polishItems
              ((QGraphicsScenePrivate *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  dVar7 = (double)QPainter::opacity();
  memcpy(local_58,&DAT_00b451c0,0x50);
  __src = (void *)QPainter::worldTransform();
  memcpy(local_58,__src,0x50);
  if (in_R9 == 0) {
    local_108 = (QGraphicsView *)0x0;
  }
  else {
    QWidget::parentWidget((QWidget *)0x9d8927);
    local_108 = qobject_cast<QGraphicsView*>((QObject *)0x9d892f);
  }
  qVar9 = pQVar3->rectAdjust;
  if (local_108 != (QGraphicsView *)0x0) {
    *(uint *)&pQVar3->field_0xb8 = *(uint *)&pQVar3->field_0xb8 & 0xfffffffb;
    QGraphicsView::d_func((QGraphicsView *)0x9d898e);
    QGraphicsView::d_func((QGraphicsView *)0x9d89a3);
    local_5c.super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i =
         (QFlagsStorage<QGraphicsView::OptimizationFlag>)
         QFlags<QGraphicsView::OptimizationFlag>::operator&
                   ((QFlags<QGraphicsView::OptimizationFlag> *)in_stack_fffffffffffffef0,
                    (OptimizationFlag)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
    if (IVar2 == 0) {
      pQVar3->rectAdjust = 2;
    }
    else {
      pQVar3->rectAdjust = 1;
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0x9d8a2c);
  for (iVar8 = 0; iVar8 < in_EDX; iVar8 = iVar8 + 1) {
    pQVar4 = QGraphicsItem::topLevelItem(in_stack_fffffffffffffef0);
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&pQVar4->d_ptr);
    if ((*(ulong *)&pQVar5->field_0x160 >> 0xe & 1) == 0) {
      QList<QGraphicsItem_*>::operator<<
                ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar4->d_ptr);
      *(ulong *)&pQVar5->field_0x160 = *(ulong *)&pQVar5->field_0x160 & 0xffffffffffffbfff | 0x4000;
      in_stack_fffffffffffffee8 = (parameter_type)0x0;
      QGraphicsScenePrivate::drawSubtreeRecursive
                (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                 in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_000000b8,
                 in_stack_ffffffffffffffd0,in_stack_000002b0);
    }
  }
  pQVar3->rectAdjust = qVar9;
  local_80.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_80 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_fffffffffffffef0);
  o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffef0);
  while (bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_80,o), bVar1) {
    ppQVar6 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_80);
    pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&(*ppQVar6)->d_ptr);
    *(ulong *)&pQVar5->field_0x160 = *(ulong *)&pQVar5->field_0x160 & 0xffffffffffffbfff;
    QList<QGraphicsItem_*>::const_iterator::operator++(&local_80);
  }
  QPainter::setWorldTransform(in_RSI,SUB81(local_58,0));
  QPainter::setOpacity(dVar7);
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9d8c16);
  if (*(QGraphicsScenePrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::drawItems(QPainter *painter,
                               int numItems,
                               QGraphicsItem *items[],
                               const QStyleOptionGraphicsItem options[], QWidget *widget)
{
    Q_D(QGraphicsScene);
    // Make sure we don't have unpolished items before we draw.
    if (!d->unpolishedItems.isEmpty())
        d->_q_polishItems();

    const qreal opacity = painter->opacity();
    QTransform viewTransform = painter->worldTransform();
    Q_UNUSED(options);

    // Determine view, expose and flags.
    QGraphicsView *view = widget ? qobject_cast<QGraphicsView *>(widget->parentWidget()) : 0;
    QRegion *expose = nullptr;
    const quint32 oldRectAdjust = d->rectAdjust;
    if (view) {
        d->updateAll = false;
        expose = &view->d_func()->exposedRegion;
        if (view->d_func()->optimizationFlags & QGraphicsView::DontAdjustForAntialiasing)
            d->rectAdjust = 1;
        else
            d->rectAdjust = 2;
    }

    // Find all toplevels, they are already sorted.
    QList<QGraphicsItem *> topLevelItems;
    for (int i = 0; i < numItems; ++i) {
        QGraphicsItem *item = items[i]->topLevelItem();
        if (!item->d_ptr->itemDiscovered) {
            topLevelItems << item;
            item->d_ptr->itemDiscovered = 1;
            d->drawSubtreeRecursive(item, painter, &viewTransform, expose, widget);
        }
    }

    d->rectAdjust = oldRectAdjust;
    // Reset discovery bits.
    for (auto topLevelItem : std::as_const(topLevelItems))
        topLevelItem->d_ptr->itemDiscovered = 0;

    painter->setWorldTransform(viewTransform);
    painter->setOpacity(opacity);
}